

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::HandleLevel2
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  const_iterator __position;
  _List_node_base *p_Var1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  cmConditionEvaluator *pcVar5;
  char *pcVar6;
  ostream *poVar7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  PolicyID id;
  _List_node_base *p_Var9;
  iterator iVar10;
  cmConditionEvaluator *pcVar11;
  cmMakefile *pcVar12;
  _Self __tmp_2;
  _Self __tmp;
  cmConditionEvaluator *this_00;
  _Self __tmp_1;
  cmExpandedCommandArgument *pcVar13;
  iterator iVar14;
  bool bVar15;
  allocator local_30c;
  char local_30b;
  allocator local_30a;
  allocator local_309;
  _List_node_base *local_308;
  iterator local_300;
  int reducible;
  iterator local_2f0;
  iterator arg;
  char *def;
  cmConditionEvaluator *local_2d8;
  double rhs;
  string *local_2b0;
  MessageType *local_2a8;
  _List_node_base *local_2a0;
  RegularExpression regEntry;
  string def_buf;
  ostringstream error;
  
  def_buf._M_dataplus._M_p = (pointer)&def_buf.field_2;
  def_buf._M_string_length = 0;
  def_buf.field_2._M_local_buf[0] = '\0';
  local_308 = (_List_node_base *)newArgs;
  local_2d8 = this;
  local_2b0 = errorString;
  local_2a8 = status;
  do {
    reducible = 0;
    arg._M_node = local_308;
    while (p_Var9 = (arg._M_node)->_M_next, arg._M_node = p_Var9, p_Var9 != local_308) {
      __position._M_node = p_Var9->_M_next;
      local_300._M_node = __position._M_node;
      local_2f0._M_node = __position._M_node;
      if ((__position._M_node != local_308) &&
         (local_300._M_node = (__position._M_node)->_M_next, local_300._M_node != local_308)) {
        std::__cxx11::string::string((string *)&error,"MATCHES",(allocator *)&regEntry);
        bVar2 = IsKeyword(local_2d8,(string *)&error,
                          (cmExpandedCommandArgument *)(__position._M_node + 1));
        std::__cxx11::string::~string((string *)&error);
        iVar10 = arg;
        if (bVar2) {
          pcVar13 = (cmExpandedCommandArgument *)(arg._M_node + 1);
          def = GetVariableOrString(local_2d8,pcVar13);
          if ((def != (pcVar13->Value)._M_dataplus._M_p) &&
             (bVar2 = cmHasLiteralPrefix<std::__cxx11::string,13ul>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pcVar13,(char (*) [13])"CMAKE_MATCH_"), bVar2)) {
            std::__cxx11::string::assign((char *)&def_buf);
            def = def_buf._M_dataplus._M_p;
          }
          iVar14._M_node = local_300._M_node;
          local_2a0 = iVar10._M_node;
          p_Var1 = local_300._M_node[1]._M_next;
          cmMakefile::ClearMatches(local_2d8->Makefile);
          regEntry.program = (char *)0x0;
          local_30b = cmsys::RegularExpression::compile(&regEntry,(char *)p_Var1);
          if ((bool)local_30b) {
            bVar2 = cmsys::RegularExpression::find(&regEntry,def);
            if (bVar2) {
              cmMakefile::StoreMatches(local_2d8->Makefile,&regEntry);
              std::__cxx11::string::string((string *)&rhs,"1",&local_30c);
              std::__cxx11::string::string((string *)&error,(string *)&rhs);
            }
            else {
              std::__cxx11::string::string((string *)&rhs,"0",&local_30c);
              std::__cxx11::string::string((string *)&error,(string *)&rhs);
            }
            cmExpandedCommandArgument::operator=(pcVar13,(cmExpandedCommandArgument *)&error);
            std::__cxx11::string::~string((string *)&error);
            std::__cxx11::string::~string((string *)&rhs);
            p_Var1 = local_308;
            std::__cxx11::
            list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::erase
                      ((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                        *)local_308,(const_iterator)iVar14._M_node);
            std::__cxx11::
            list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::erase
                      ((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                        *)p_Var1,__position);
            local_2f0._M_node = local_2a0;
            if ((local_2a0 != p_Var1) &&
               (local_2f0._M_node = local_2a0->_M_next, local_300._M_node = local_2f0._M_node,
               local_2f0._M_node != local_308)) {
              local_300._M_node = (local_2f0._M_node)->_M_next;
            }
            reducible = 1;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
            poVar7 = std::operator<<((ostream *)&error,"Regular expression \"");
            poVar7 = std::operator<<(poVar7,(char *)p_Var1);
            std::operator<<(poVar7,"\" cannot compile");
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::operator=((string *)local_2b0,(string *)&rhs);
            std::__cxx11::string::~string((string *)&rhs);
            *local_2a8 = FATAL_ERROR;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
          }
          cmsys::RegularExpression::~RegularExpression(&regEntry);
          if (local_30b == '\0') goto LAB_00303dc9;
        }
      }
      iVar10._M_node = local_2f0._M_node;
      this_00 = local_2d8;
      if (local_2f0._M_node != local_308) {
        std::__cxx11::string::string((string *)&error,"MATCHES",(allocator *)&regEntry);
        this_00 = local_2d8;
        iVar14 = arg;
        pcVar13 = (cmExpandedCommandArgument *)(arg._M_node + 1);
        bVar2 = IsKeyword(local_2d8,(string *)&error,pcVar13);
        std::__cxx11::string::~string((string *)&error);
        if (bVar2) {
          std::__cxx11::string::string((string *)&regEntry,"0",(allocator *)&rhs);
          std::__cxx11::string::string((string *)&error,(string *)&regEntry);
          cmExpandedCommandArgument::operator=(pcVar13,(cmExpandedCommandArgument *)&error);
          std::__cxx11::string::~string((string *)&error);
          std::__cxx11::string::~string((string *)&regEntry);
          p_Var9 = local_308;
          std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
          ::erase((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                  local_308,(const_iterator)iVar10._M_node);
          local_2f0._M_node = iVar14._M_node;
          if ((iVar14._M_node != p_Var9) &&
             (local_2f0._M_node = (iVar14._M_node)->_M_next, local_300._M_node = local_2f0._M_node,
             local_2f0._M_node != p_Var9)) {
            local_300._M_node = (local_2f0._M_node)->_M_next;
          }
          reducible = 1;
          iVar10._M_node = local_2f0._M_node;
        }
      }
      if ((iVar10._M_node != local_308) && (local_300._M_node != local_308)) {
        std::__cxx11::string::string((string *)&error,"LESS",&local_30c);
        pcVar13 = (cmExpandedCommandArgument *)(iVar10._M_node + 1);
        bVar2 = IsKeyword(this_00,(string *)&error,pcVar13);
        if (bVar2) {
LAB_003035dc:
          std::__cxx11::string::~string((string *)&error);
        }
        else {
          std::__cxx11::string::string((string *)&regEntry,"GREATER",&local_309);
          bVar2 = IsKeyword(this_00,(string *)&regEntry,pcVar13);
          if (bVar2) {
            std::__cxx11::string::~string((string *)&regEntry);
            goto LAB_003035dc;
          }
          std::__cxx11::string::string((string *)&rhs,"EQUAL",&local_30a);
          bVar2 = IsKeyword(this_00,(string *)&rhs,pcVar13);
          std::__cxx11::string::~string((string *)&rhs);
          std::__cxx11::string::~string((string *)&regEntry);
          std::__cxx11::string::~string((string *)&error);
          if (!bVar2) goto LAB_00303778;
        }
        def = GetVariableOrString(this_00,(cmExpandedCommandArgument *)(arg._M_node + 1));
        pcVar5 = (cmConditionEvaluator *)
                 GetVariableOrString(this_00,(cmExpandedCommandArgument *)(local_300._M_node + 1));
        bVar2 = false;
        pcVar11 = (cmConditionEvaluator *)def;
        iVar4 = __isoc99_sscanf(def,"%lg",&regEntry);
        if (iVar4 == 1) {
          bVar2 = false;
          iVar4 = __isoc99_sscanf(pcVar5,"%lg",&rhs);
          pcVar11 = pcVar5;
          if (iVar4 == 1) {
            pcVar11 = (cmConditionEvaluator *)&error;
            std::__cxx11::string::string((string *)pcVar11,"LESS",&local_30c);
            _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)pcVar13,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)pcVar11);
            pcVar5 = pcVar11;
            std::__cxx11::string::~string((string *)pcVar11);
            if (_Var3) {
              bVar2 = rhs == (double)regEntry.startp[0];
              bVar15 = rhs < (double)regEntry.startp[0];
              pcVar11 = pcVar5;
            }
            else {
              std::__cxx11::string::string((string *)pcVar11,"GREATER",&local_30c);
              _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)pcVar13,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)pcVar11);
              std::__cxx11::string::~string((string *)pcVar11);
              if (!_Var3) {
                bVar2 = (bool)(-((double)regEntry.startp[0] == rhs) & 1);
                goto LAB_0030374a;
              }
              bVar2 = (double)regEntry.startp[0] == rhs;
              bVar15 = (double)regEntry.startp[0] < rhs;
            }
            bVar2 = !bVar15 && !bVar2;
          }
        }
LAB_0030374a:
        HandleBinaryOp(pcVar11,bVar2,&reducible,&arg,(cmArgumentList *)local_308,&local_2f0,
                       &local_300);
      }
LAB_00303778:
      iVar14._M_node = local_2f0._M_node;
      iVar10._M_node = local_300._M_node;
      if (local_300._M_node != local_308 && local_2f0._M_node != local_308) {
        std::__cxx11::string::string((string *)&error,"STRLESS",&local_30c);
        pcVar13 = (cmExpandedCommandArgument *)(iVar14._M_node + 1);
        bVar2 = IsKeyword(this_00,(string *)&error,pcVar13);
        if (bVar2) {
LAB_00303807:
          std::__cxx11::string::~string((string *)&error);
        }
        else {
          std::__cxx11::string::string((string *)&regEntry,"STREQUAL",&local_309);
          bVar2 = IsKeyword(this_00,(string *)&regEntry,pcVar13);
          if (bVar2) {
            std::__cxx11::string::~string((string *)&regEntry);
            goto LAB_00303807;
          }
          std::__cxx11::string::string((string *)&rhs,"STRGREATER",&local_30a);
          bVar2 = IsKeyword(this_00,(string *)&rhs,pcVar13);
          std::__cxx11::string::~string((string *)&rhs);
          std::__cxx11::string::~string((string *)&regEntry);
          std::__cxx11::string::~string((string *)&error);
          if (!bVar2) goto LAB_00303956;
        }
        def = GetVariableOrString(this_00,(cmExpandedCommandArgument *)(arg._M_node + 1));
        pcVar6 = GetVariableOrString(this_00,(cmExpandedCommandArgument *)(iVar10._M_node + 1));
        iVar4 = strcmp(def,pcVar6);
        pcVar11 = (cmConditionEvaluator *)&error;
        std::__cxx11::string::string((string *)pcVar11,"STRLESS",(allocator *)&regEntry);
        _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )pcVar13,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)pcVar11);
        pcVar5 = pcVar11;
        std::__cxx11::string::~string((string *)pcVar11);
        this_00 = local_2d8;
        if (_Var3) {
          bVar2 = SUB41((uint)iVar4 >> 0x1f,0);
          pcVar11 = pcVar5;
        }
        else {
          std::__cxx11::string::string((string *)pcVar11,"STRGREATER",(allocator *)&regEntry);
          _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)pcVar13,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)pcVar11);
          std::__cxx11::string::~string((string *)pcVar11);
          if (_Var3) {
            bVar2 = 0 < iVar4;
          }
          else {
            bVar2 = iVar4 == 0;
          }
        }
        HandleBinaryOp(pcVar11,bVar2,&reducible,&arg,(cmArgumentList *)local_308,&local_2f0,
                       &local_300);
        iVar10._M_node = local_300._M_node;
        iVar14._M_node = local_2f0._M_node;
      }
LAB_00303956:
      p_Var9 = local_308;
      if ((iVar14._M_node != local_308) && (iVar10._M_node != local_308)) {
        std::__cxx11::string::string((string *)&error,"VERSION_LESS",&local_30c);
        pcVar13 = (cmExpandedCommandArgument *)(iVar14._M_node + 1);
        bVar2 = IsKeyword(this_00,(string *)&error,pcVar13);
        if (bVar2) {
LAB_003039de:
          std::__cxx11::string::~string((string *)&error);
        }
        else {
          std::__cxx11::string::string((string *)&regEntry,"VERSION_GREATER",&local_309);
          bVar2 = IsKeyword(this_00,(string *)&regEntry,pcVar13);
          if (bVar2) {
            std::__cxx11::string::~string((string *)&regEntry);
            goto LAB_003039de;
          }
          std::__cxx11::string::string((string *)&rhs,"VERSION_EQUAL",&local_30a);
          bVar2 = IsKeyword(this_00,(string *)&rhs,pcVar13);
          std::__cxx11::string::~string((string *)&rhs);
          std::__cxx11::string::~string((string *)&regEntry);
          std::__cxx11::string::~string((string *)&error);
          p_Var9 = local_308;
          if (!bVar2) goto LAB_00303ac2;
        }
        def = GetVariableOrString(this_00,(cmExpandedCommandArgument *)(arg._M_node + 1));
        pcVar6 = GetVariableOrString(this_00,(cmExpandedCommandArgument *)(local_300._M_node + 1));
        std::__cxx11::string::string((string *)&error,"VERSION_LESS",(allocator *)&regEntry);
        _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )pcVar13,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&error);
        std::__cxx11::string::~string((string *)&error);
        this_00 = local_2d8;
        pcVar11 = (cmConditionEvaluator *)0x0;
        if (!_Var3) {
          std::__cxx11::string::string((string *)&error,"VERSION_GREATER",(allocator *)&regEntry);
          _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)pcVar13,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&error);
          std::__cxx11::string::~string((string *)&error);
          pcVar11 = (cmConditionEvaluator *)(ulong)(2 - _Var3);
        }
        bVar2 = cmSystemTools::VersionCompare((CompareOp)pcVar11,def,pcVar6);
        p_Var9 = local_308;
        HandleBinaryOp(pcVar11,bVar2,&reducible,&arg,(cmArgumentList *)local_308,&local_2f0,
                       &local_300);
      }
LAB_00303ac2:
      iVar14._M_node = local_2f0._M_node;
      iVar10._M_node = local_300._M_node;
      if (local_300._M_node != p_Var9 && local_2f0._M_node != p_Var9) {
        std::__cxx11::string::string((string *)&error,"IS_NEWER_THAN",(allocator *)&regEntry);
        bVar2 = IsKeyword(this_00,(string *)&error,(cmExpandedCommandArgument *)(iVar14._M_node + 1)
                         );
        std::__cxx11::string::~string((string *)&error);
        if (bVar2) {
          _error = 0;
          pcVar11 = (cmConditionEvaluator *)(arg._M_node + 1);
          bVar2 = cmsys::SystemTools::FileTimeCompare
                            ((string *)pcVar11,(string *)(iVar10._M_node + 1),(int *)&error);
          HandleBinaryOp(pcVar11,_error < 2 || !bVar2,&reducible,&arg,(cmArgumentList *)local_308,
                         &local_2f0,&local_300);
          iVar14._M_node = local_2f0._M_node;
          iVar10._M_node = local_300._M_node;
        }
      }
      if ((iVar14._M_node != local_308) && (iVar10._M_node != local_308)) {
        std::__cxx11::string::string((string *)&error,"IN_LIST",(allocator *)&regEntry);
        bVar2 = IsKeyword(this_00,(string *)&error,(cmExpandedCommandArgument *)(iVar14._M_node + 1)
                         );
        std::__cxx11::string::~string((string *)&error);
        if (bVar2) {
          if (this_00->Policy57Status < NEW) {
            if (this_00->Policy57Status == WARN) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
              cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&regEntry,(cmPolicies *)0x39,id);
              poVar7 = std::operator<<((ostream *)&error,(string *)&regEntry);
              std::operator<<(poVar7,"\n");
              std::__cxx11::string::~string((string *)&regEntry);
              std::operator<<((ostream *)&error,
                              "IN_LIST will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                             );
              pcVar12 = this_00->Makefile;
              std::__cxx11::stringbuf::str();
              cmMakefile::IssueMessage(pcVar12,AUTHOR_WARNING,(string *)&regEntry,false);
              std::__cxx11::string::~string((string *)&regEntry);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
            }
          }
          else {
            def = GetVariableOrString(this_00,(cmExpandedCommandArgument *)(arg._M_node + 1));
            pcVar12 = this_00->Makefile;
            pcVar6 = cmMakefile::GetDefinition(pcVar12,(string *)(local_300._M_node + 1));
            if (pcVar6 == (char *)0x0) {
              bVar2 = false;
            }
            else {
              regEntry.startp[0] = (char *)0x0;
              regEntry.startp[1] = (char *)0x0;
              regEntry.startp[2] = (char *)0x0;
              std::__cxx11::string::string((string *)&error,pcVar6,(allocator *)&rhs);
              pcVar12 = (cmMakefile *)&regEntry;
              cmSystemTools::ExpandListArgument
                        ((string *)&error,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)pcVar12,true);
              std::__cxx11::string::~string((string *)&error);
              _Var8 = std::
                      __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                                (regEntry.startp[0],regEntry.startp[1],&def);
              bVar2 = _Var8._M_current !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      regEntry.startp[1];
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)pcVar12);
            }
            HandleBinaryOp((cmConditionEvaluator *)pcVar12,bVar2,&reducible,&arg,
                           (cmArgumentList *)local_308,&local_2f0,&local_300);
          }
        }
      }
    }
  } while (reducible != 0);
LAB_00303dc9:
  bVar2 = p_Var9 == local_308;
  std::__cxx11::string::~string((string *)&def_buf);
  return bVar2;
}

Assistant:

bool cmConditionEvaluator::HandleLevel2(cmArgumentList &newArgs,
                  std::string &errorString,
                  cmake::MessageType &status)
{
  int reducible;
  std::string def_buf;
  const char *def;
  const char *def2;
  do
    {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end())
      {
      argP1 = arg;
      this->IncrementArguments(newArgs,argP1,argP2);
      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
        IsKeyword("MATCHES", *argP1))
        {
        def = this->GetVariableOrString(*arg);
        if (def != arg->c_str() // yes, we compare the pointer value
            && cmHasLiteralPrefix(arg->GetValue(), "CMAKE_MATCH_"))
          {
          // The string to match is owned by our match result variables.
          // Move it to our own buffer before clearing them.
          def_buf = def;
          def = def_buf.c_str();
          }
        const char* rex = argP2->c_str();
        this->Makefile.ClearMatches();
        cmsys::RegularExpression regEntry;
        if ( !regEntry.compile(rex) )
          {
          std::ostringstream error;
          error << "Regular expression \"" << rex << "\" cannot compile";
          errorString = error.str();
          status = cmake::FATAL_ERROR;
          return false;
          }
        if (regEntry.find(def))
          {
          this->Makefile.StoreMatches(regEntry);
          *arg = cmExpandedCommandArgument("1", true);
          }
        else
          {
          *arg = cmExpandedCommandArgument("0", true);
          }
        newArgs.erase(argP2);
        newArgs.erase(argP1);
        argP1 = arg;
        this->IncrementArguments(newArgs,argP1,argP2);
        reducible = 1;
        }

      if (argP1 != newArgs.end() && this->IsKeyword("MATCHES", *arg))
        {
        *arg = cmExpandedCommandArgument("0", true);
        newArgs.erase(argP1);
        argP1 = arg;
        this->IncrementArguments(newArgs,argP1,argP2);
        reducible = 1;
        }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
        (this->IsKeyword("LESS", *argP1) ||
         this->IsKeyword("GREATER", *argP1) ||
         this->IsKeyword("EQUAL", *argP1)))
        {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        double lhs;
        double rhs;
        bool result;
        if(sscanf(def, "%lg", &lhs) != 1 ||
           sscanf(def2, "%lg", &rhs) != 1)
          {
          result = false;
          }
        else if (*(argP1) == "LESS")
          {
          result = (lhs < rhs);
          }
        else if (*(argP1) == "GREATER")
          {
          result = (lhs > rhs);
          }
        else
          {
          result = (lhs == rhs);
          }
        this->HandleBinaryOp(result,
          reducible, arg, newArgs, argP1, argP2);
        }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
        (this->IsKeyword("STRLESS", *argP1) ||
         this->IsKeyword("STREQUAL", *argP1) ||
         this->IsKeyword("STRGREATER", *argP1)))
        {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        int val = strcmp(def,def2);
        bool result;
        if (*(argP1) == "STRLESS")
          {
          result = (val < 0);
          }
        else if (*(argP1) == "STRGREATER")
          {
          result = (val > 0);
          }
        else // strequal
          {
          result = (val == 0);
          }
        this->HandleBinaryOp(result,
          reducible, arg, newArgs, argP1, argP2);
        }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
        (this->IsKeyword("VERSION_LESS", *argP1) ||
         this->IsKeyword("VERSION_GREATER", *argP1) ||
         this->IsKeyword("VERSION_EQUAL", *argP1)))
        {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        cmSystemTools::CompareOp op = cmSystemTools::OP_EQUAL;
        if(*argP1 == "VERSION_LESS")
          {
          op = cmSystemTools::OP_LESS;
          }
        else if(*argP1 == "VERSION_GREATER")
          {
          op = cmSystemTools::OP_GREATER;
          }
        bool result = cmSystemTools::VersionCompare(op, def, def2);
        this->HandleBinaryOp(result,
          reducible, arg, newArgs, argP1, argP2);
        }

      // is file A newer than file B
      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          this->IsKeyword("IS_NEWER_THAN", *argP1))
        {
        int fileIsNewer=0;
        bool success=cmSystemTools::FileTimeCompare(arg->GetValue(),
            (argP2)->GetValue(),
            &fileIsNewer);
        this->HandleBinaryOp(
          (success==false || fileIsNewer==1 || fileIsNewer==0),
          reducible, arg, newArgs, argP1, argP2);
        }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          this->IsKeyword("IN_LIST", *argP1))
        {
        if(this->Policy57Status != cmPolicies::OLD &&
          this->Policy57Status != cmPolicies::WARN)
          {
          bool result = false;

          def = this->GetVariableOrString(*arg);
          def2 = this->Makefile.GetDefinition(argP2->GetValue());

          if(def2)
            {
            std::vector<std::string> list;
            cmSystemTools::ExpandListArgument(def2, list, true);

            result = std::find(list.begin(), list.end(), def) != list.end();
            }

          this->HandleBinaryOp(result,
            reducible, arg, newArgs, argP1, argP2);
          }
          else if(this->Policy57Status == cmPolicies::WARN)
            {
            std::ostringstream e;
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0057) << "\n";
            e << "IN_LIST will be interpreted as an operator "
              "when the policy is set to NEW.  "
              "Since the policy is not set the OLD behavior will be used.";

            this->Makefile.IssueMessage(cmake::AUTHOR_WARNING, e.str());
            }
        }

      ++arg;
      }
    }
  while (reducible);
  return true;
}